

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Cgemm_c(char ta,char tb,int m,int n,int k,SingleComplex alpha,int g_a,int g_b,
               SingleComplex beta,int g_c)

{
  char tb_local;
  char ta_local;
  long local_48;
  SingleComplex alpha_local;
  SingleComplex beta_local;
  
  local_48 = (long)g_b;
  tb_local = tb;
  ta_local = ta;
  alpha_local = alpha;
  beta_local = beta;
  pnga_matmul(&ta_local,&tb_local,&alpha_local,&beta_local,(long)g_a,1,(long)m,1,(long)k,local_48,1,
              (long)k,1,(long)n,(long)g_c,1,(long)m,1,(long)n);
  return;
}

Assistant:

void GA_Cgemm_c(char ta, char tb, int m, int n, int k,
              SingleComplex alpha, int g_a, int g_b, 
	      SingleComplex beta, int g_c )
{
  Integer G_a = g_a;
  Integer G_b = g_b;
  Integer G_c = g_c;

  Integer ailo = 1;
  Integer aihi = m;
  Integer ajlo = 1;
  Integer ajhi = k;
  
  Integer bilo = 1;
  Integer bihi = k;
  Integer bjlo = 1;
  Integer bjhi = n;
  
  Integer cilo = 1;
  Integer cihi = m;
  Integer cjlo = 1;
  Integer cjhi = n;
  
  pnga_matmul(&ta, &tb, (float *)&alpha,(float *)&beta,
	    G_a, ailo, aihi, ajlo, ajhi,
	    G_b, bilo, bihi, bjlo, bjhi,
	    G_c, cilo, cihi, cjlo, cjhi);
}